

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

xmlBufPtr xmlBufFromBuffer(xmlBufferPtr buffer)

{
  xmlBufPtr pxVar1;
  xmlChar *pxVar2;
  ulong uVar3;
  
  if ((buffer != (xmlBufferPtr)0x0) &&
     (pxVar1 = (xmlBufPtr)(*xmlMalloc)(0x38), pxVar1 != (xmlBufPtr)0x0)) {
    pxVar1->use = (ulong)buffer->use;
    pxVar1->flags = 0;
    pxVar1->maxSize = 0xfffffffffffffffe;
    pxVar2 = buffer->content;
    if (pxVar2 == (xmlChar *)0x0) {
      pxVar1->size = 0x32;
      pxVar2 = (xmlChar *)(*xmlMalloc)(0x33);
      pxVar1->mem = pxVar2;
      pxVar1->content = pxVar2;
      if (pxVar2 == (xmlChar *)0x0) {
        if ((pxVar1->flags & 3) == 0) {
          pxVar1->flags = pxVar1->flags | 1;
        }
      }
      else {
        *pxVar2 = '\0';
      }
    }
    else {
      pxVar1->size = (ulong)(buffer->size - 1);
      pxVar1->content = pxVar2;
      if (buffer->alloc == XML_BUFFER_ALLOC_IO) {
        pxVar2 = buffer->contentIO;
      }
      pxVar1->mem = pxVar2;
    }
    uVar3 = pxVar1->size;
    if (0x7ffffffe < uVar3) {
      uVar3 = 0x7fffffff;
    }
    pxVar1->compat_size = (uint)uVar3;
    uVar3 = 0x7fffffff;
    if (pxVar1->use < 0x7fffffff) {
      uVar3 = pxVar1->use;
    }
    pxVar1->compat_use = (uint)uVar3;
    return pxVar1;
  }
  return (xmlBufPtr)0x0;
}

Assistant:

xmlBufPtr
xmlBufFromBuffer(xmlBufferPtr buffer) {
    xmlBufPtr ret;

    if (buffer == NULL)
        return(NULL);

    ret = xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL)
        return(NULL);

    ret->use = buffer->use;
    ret->flags = 0;
    ret->maxSize = SIZE_MAX - 1;

    if (buffer->content == NULL) {
        ret->size = 50;
        ret->mem = xmlMalloc(ret->size + 1);
        ret->content = ret->mem;
        if (ret->mem == NULL)
            xmlBufMemoryError(ret);
        else
            ret->content[0] = 0;
    } else {
        ret->size = buffer->size - 1;
        ret->content = buffer->content;
        if (buffer->alloc == XML_BUFFER_ALLOC_IO)
            ret->mem = buffer->contentIO;
        else
            ret->mem = buffer->content;
    }

    UPDATE_COMPAT(ret);
    return(ret);
}